

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O3

Value * __thiscall Json::Value::operator[](Value *this,ArrayIndex index)

{
  bool bVar1;
  ObjectValues *pOVar2;
  iterator __pos;
  _Base_ptr p_Var3;
  CZString key;
  value_type defaultValue;
  String local_1c0;
  pair<const_Json::Value::CZString,_Json::Value> local_1a0 [6];
  
  if (*(char *)&this->bits_ == '\0') {
    Value((Value *)local_1a0,arrayValue);
    swap((Value *)local_1a0,this);
    ~Value((Value *)local_1a0);
  }
  else if (*(char *)&this->bits_ != '\x06') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"in Json::Value::operator[](ArrayIndex): requires arrayValue",
               0x3b);
    std::__cxx11::stringbuf::str();
    throwLogicError(&local_1c0);
  }
  CZString::CZString((CZString *)&local_1c0,index);
  pOVar2 = (this->value_).map_;
  p_Var3 = (pOVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  __pos._M_node = &(pOVar2->_M_t)._M_impl.super__Rb_tree_header._M_header;
  if (p_Var3 != (_Base_ptr)0x0) {
    do {
      bVar1 = CZString::operator<((CZString *)(p_Var3 + 1),(CZString *)&local_1c0);
      if (!bVar1) {
        __pos._M_node = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[bVar1];
    } while (p_Var3 != (_Base_ptr)0x0);
    pOVar2 = (this->value_).map_;
  }
  if ((_Rb_tree_header *)__pos._M_node != &(pOVar2->_M_t)._M_impl.super__Rb_tree_header) {
    bVar1 = CZString::operator==((CZString *)(__pos._M_node + 1),(CZString *)&local_1c0);
    if (bVar1) goto LAB_001520bc;
  }
  nullSingleton();
  CZString::CZString(&local_1a0[0].first,(CZString *)&local_1c0);
  Value(&local_1a0[0].second,&nullSingleton::nullStatic);
  __pos = std::
          _Rb_tree<Json::Value::CZString,std::pair<Json::Value::CZString_const,Json::Value>,std::_Select1st<std::pair<Json::Value::CZString_const,Json::Value>>,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
          ::_M_emplace_hint_unique<std::pair<Json::Value::CZString_const,Json::Value>&>
                    ((_Rb_tree<Json::Value::CZString,std::pair<Json::Value::CZString_const,Json::Value>,std::_Select1st<std::pair<Json::Value::CZString_const,Json::Value>>,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
                      *)(this->value_).map_,__pos._M_node,local_1a0);
  ~Value(&local_1a0[0].second);
  CZString::~CZString(&local_1a0[0].first);
LAB_001520bc:
  CZString::~CZString((CZString *)&local_1c0);
  return (Value *)&__pos._M_node[1]._M_left;
}

Assistant:

Value& Value::operator[](ArrayIndex index) {
  JSON_ASSERT_MESSAGE(
      type() == nullValue || type() == arrayValue,
      "in Json::Value::operator[](ArrayIndex): requires arrayValue");
  if (type() == nullValue)
    *this = Value(arrayValue);
  CZString key(index);
  auto it = value_.map_->lower_bound(key);
  if (it != value_.map_->end() && (*it).first == key)
    return (*it).second;

  ObjectValues::value_type defaultValue(key, nullSingleton());
  it = value_.map_->insert(it, defaultValue);
  return (*it).second;
}